

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  bool bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  Primitive *prim;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  undefined1 auVar27 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  Ray *local_1300;
  ulong local_12f8;
  ulong *local_12f0;
  RayQueryContext *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_12f0 = local_11d0;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar3,auVar26);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar31,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar3,auVar31,auVar26);
      auVar31 = vrcpps_avx(auVar26);
      fVar25 = auVar31._0_4_;
      auVar22._0_4_ = fVar25 * auVar26._0_4_;
      fVar28 = auVar31._4_4_;
      auVar22._4_4_ = fVar28 * auVar26._4_4_;
      fVar29 = auVar31._8_4_;
      auVar22._8_4_ = fVar29 * auVar26._8_4_;
      fVar30 = auVar31._12_4_;
      auVar22._12_4_ = fVar30 * auVar26._12_4_;
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar32,auVar22);
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar2;
      local_11f8._0_4_ = uVar2;
      local_11f8._8_4_ = uVar2;
      local_11f8._12_4_ = uVar2;
      local_11f8._16_4_ = uVar2;
      local_11f8._20_4_ = uVar2;
      local_11f8._24_4_ = uVar2;
      local_11f8._28_4_ = uVar2;
      auVar34 = ZEXT3264(local_11f8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar2;
      local_1218._0_4_ = uVar2;
      local_1218._8_4_ = uVar2;
      local_1218._12_4_ = uVar2;
      local_1218._16_4_ = uVar2;
      local_1218._20_4_ = uVar2;
      local_1218._24_4_ = uVar2;
      local_1218._28_4_ = uVar2;
      auVar35 = ZEXT3264(local_1218);
      auVar23._0_4_ = fVar25 + fVar25 * auVar26._0_4_;
      auVar23._4_4_ = fVar28 + fVar28 * auVar26._4_4_;
      auVar23._8_4_ = fVar29 + fVar29 * auVar26._8_4_;
      auVar23._12_4_ = fVar30 + fVar30 * auVar26._12_4_;
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar2;
      local_1238._0_4_ = uVar2;
      local_1238._8_4_ = uVar2;
      local_1238._12_4_ = uVar2;
      local_1238._16_4_ = uVar2;
      local_1238._20_4_ = uVar2;
      local_1238._24_4_ = uVar2;
      local_1238._28_4_ = uVar2;
      auVar36 = ZEXT3264(local_1238);
      auVar26 = vshufps_avx(auVar23,auVar23,0);
      local_1258._16_16_ = auVar26;
      local_1258._0_16_ = auVar26;
      auVar37 = ZEXT3264(local_1258);
      auVar26 = vmovshdup_avx(auVar23);
      auVar31 = vshufps_avx(auVar23,auVar23,0x55);
      local_1278._16_16_ = auVar31;
      local_1278._0_16_ = auVar31;
      auVar38 = ZEXT3264(local_1278);
      auVar31 = vshufpd_avx(auVar23,auVar23,1);
      auVar22 = vshufps_avx(auVar23,auVar23,0xaa);
      local_12f8 = (ulong)(auVar23._0_4_ < 0.0) << 5;
      uVar17 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x40;
      local_1298._16_16_ = auVar22;
      local_1298._0_16_ = auVar22;
      auVar24 = ZEXT3264(local_1298);
      uVar21 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x80;
      uVar18 = local_12f8 ^ 0x20;
      auVar26 = vshufps_avx(auVar5,auVar5,0);
      local_12b8._16_16_ = auVar26;
      local_12b8._0_16_ = auVar26;
      auVar27 = ZEXT3264(local_12b8);
      auVar26 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      local_12d8._16_16_ = auVar26;
      local_12d8._0_16_ = auVar26;
      auVar33 = ZEXT3264(local_12d8);
      uVar19 = local_12f8;
      local_1300 = ray;
      local_12e8 = context;
LAB_002f1992:
      do {
        uVar20 = local_12f0[-1];
        local_12f0 = local_12f0 + -1;
        while ((uVar20 & 8) == 0) {
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar19),auVar34._0_32_);
          auVar7._4_4_ = auVar37._4_4_ * auVar6._4_4_;
          auVar7._0_4_ = auVar37._0_4_ * auVar6._0_4_;
          auVar7._8_4_ = auVar37._8_4_ * auVar6._8_4_;
          auVar7._12_4_ = auVar37._12_4_ * auVar6._12_4_;
          auVar7._16_4_ = auVar37._16_4_ * auVar6._16_4_;
          auVar7._20_4_ = auVar37._20_4_ * auVar6._20_4_;
          auVar7._24_4_ = auVar37._24_4_ * auVar6._24_4_;
          auVar7._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar17),auVar35._0_32_);
          auVar8._4_4_ = auVar38._4_4_ * auVar6._4_4_;
          auVar8._0_4_ = auVar38._0_4_ * auVar6._0_4_;
          auVar8._8_4_ = auVar38._8_4_ * auVar6._8_4_;
          auVar8._12_4_ = auVar38._12_4_ * auVar6._12_4_;
          auVar8._16_4_ = auVar38._16_4_ * auVar6._16_4_;
          auVar8._20_4_ = auVar38._20_4_ * auVar6._20_4_;
          auVar8._24_4_ = auVar38._24_4_ * auVar6._24_4_;
          auVar8._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar7,auVar8);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar21),auVar36._0_32_);
          auVar9._4_4_ = auVar24._4_4_ * auVar7._4_4_;
          auVar9._0_4_ = auVar24._0_4_ * auVar7._0_4_;
          auVar9._8_4_ = auVar24._8_4_ * auVar7._8_4_;
          auVar9._12_4_ = auVar24._12_4_ * auVar7._12_4_;
          auVar9._16_4_ = auVar24._16_4_ * auVar7._16_4_;
          auVar9._20_4_ = auVar24._20_4_ * auVar7._20_4_;
          auVar9._24_4_ = auVar24._24_4_ * auVar7._24_4_;
          auVar9._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar9,auVar27._0_32_);
          auVar6 = vmaxps_avx(auVar6,auVar7);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar18),auVar34._0_32_);
          auVar10._4_4_ = auVar37._4_4_ * auVar7._4_4_;
          auVar10._0_4_ = auVar37._0_4_ * auVar7._0_4_;
          auVar10._8_4_ = auVar37._8_4_ * auVar7._8_4_;
          auVar10._12_4_ = auVar37._12_4_ * auVar7._12_4_;
          auVar10._16_4_ = auVar37._16_4_ * auVar7._16_4_;
          auVar10._20_4_ = auVar37._20_4_ * auVar7._20_4_;
          auVar10._24_4_ = auVar37._24_4_ * auVar7._24_4_;
          auVar10._28_4_ = auVar7._28_4_;
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar17 ^ 0x20)),auVar35._0_32_
                             );
          auVar11._4_4_ = auVar38._4_4_ * auVar7._4_4_;
          auVar11._0_4_ = auVar38._0_4_ * auVar7._0_4_;
          auVar11._8_4_ = auVar38._8_4_ * auVar7._8_4_;
          auVar11._12_4_ = auVar38._12_4_ * auVar7._12_4_;
          auVar11._16_4_ = auVar38._16_4_ * auVar7._16_4_;
          auVar11._20_4_ = auVar38._20_4_ * auVar7._20_4_;
          auVar11._24_4_ = auVar38._24_4_ * auVar7._24_4_;
          auVar11._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar10,auVar11);
          auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar21 ^ 0x20)),auVar36._0_32_
                             );
          auVar12._4_4_ = auVar24._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar24._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar24._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar24._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar24._16_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar24._20_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar24._24_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          auVar8 = vminps_avx(auVar12,auVar33._0_32_);
          auVar7 = vminps_avx(auVar7,auVar8);
          auVar6 = vcmpps_avx(auVar6,auVar7,2);
          uVar15 = vmovmskps_avx(auVar6);
          if (uVar15 == 0) {
            if (local_12f0 == &local_11d8) {
              return;
            }
            goto LAB_002f1992;
          }
          uVar15 = uVar15 & 0xff;
          uVar14 = uVar20 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar20 = *(ulong *)(uVar14 + lVar4 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          if (uVar15 != 0) {
            *local_12f0 = uVar20;
            local_12f0 = local_12f0 + 1;
            lVar4 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar20 = *(ulong *)(uVar14 + lVar4 * 8);
            uVar15 = uVar15 - 1 & uVar15;
            uVar16 = (ulong)uVar15;
            if (uVar15 != 0) {
              do {
                *local_12f0 = uVar20;
                local_12f0 = local_12f0 + 1;
                lVar4 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                  }
                }
                uVar20 = *(ulong *)(uVar14 + lVar4 * 8);
                uVar16 = uVar16 & uVar16 - 1;
              } while (uVar16 != 0);
            }
          }
        }
        local_12e0 = (ulong)((uint)uVar20 & 0xf) - 8;
        if (local_12e0 != 0) {
          prim = (Primitive *)(uVar20 & 0xfffffffffffffff0);
          do {
            bVar13 = InstanceArrayIntersector1::occluded(&local_1301,ray,local_12e8,prim);
            if (bVar13) {
              local_1300->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_12e0 = local_12e0 + -1;
            ray = local_1300;
          } while (local_12e0 != 0);
        }
        auVar34 = ZEXT3264(local_11f8);
        auVar35 = ZEXT3264(local_1218);
        auVar36 = ZEXT3264(local_1238);
        auVar37 = ZEXT3264(local_1258);
        auVar38 = ZEXT3264(local_1278);
        auVar24 = ZEXT3264(local_1298);
        auVar27 = ZEXT3264(local_12b8);
        auVar33 = ZEXT3264(local_12d8);
        uVar19 = local_12f8;
      } while (local_12f0 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }